

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsSat.c
# Opt level: O1

int Abc_NtkMfsSolveSat(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  uint *Sign;
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  p->vProjVarsSat->nSize = 0;
  uVar7 = p->pAigWin->nObjs[3] - (pNode->vFanins).nSize;
  pVVar4 = p->pAigWin->vCos;
  if ((int)uVar7 < pVVar4->nSize) {
    uVar8 = (ulong)uVar7;
    do {
      if ((int)uVar7 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = p->pCnf->pVarNums[*(int *)((long)pVVar4->pArray[uVar8] + 0x24)];
      if (iVar2 < 0) {
        __assert_fail("p->pCnf->pVarNums[pObjPo->Id] >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/mfs/mfsSat.c"
                      ,0x67,"int Abc_NtkMfsSolveSat(Mfs_Man_t *, Abc_Obj_t *)");
      }
      pVVar1 = p->vProjVarsSat;
      uVar3 = pVVar1->nCap;
      if (pVVar1->nSize == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (pVVar1->pArray == (int *)0x0) {
            piVar5 = (int *)malloc(0x40);
          }
          else {
            piVar5 = (int *)realloc(pVVar1->pArray,0x40);
          }
          pVVar1->pArray = piVar5;
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar3 * 2;
          if (iVar6 <= (int)uVar3) goto LAB_00466156;
          if (pVVar1->pArray == (int *)0x0) {
            piVar5 = (int *)malloc((ulong)uVar3 << 3);
          }
          else {
            piVar5 = (int *)realloc(pVVar1->pArray,(ulong)uVar3 << 3);
          }
          pVVar1->pArray = piVar5;
        }
        if (piVar5 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar1->nCap = iVar6;
      }
LAB_00466156:
      iVar6 = pVVar1->nSize;
      pVVar1->nSize = iVar6 + 1;
      pVVar1->pArray[iVar6] = iVar2;
      uVar8 = uVar8 + 1;
      pVVar4 = p->pAigWin->vCos;
    } while ((int)uVar8 < pVVar4->nSize);
  }
  iVar2 = p->vProjVarsSat->nSize;
  p->nFanins = iVar2;
  iVar6 = 1 << ((char)iVar2 - 5U & 0x1f);
  if (iVar2 < 6) {
    iVar6 = 1;
  }
  p->nWords = iVar6;
  Sign = p->uCare;
  memset(Sign,0,(long)iVar6 << 2);
  p->nCares = 0;
  p->nTotConfLim = p->pPars->nBTLimit;
  do {
    iVar2 = Abc_NtkMfsSolveSat_iter(p);
  } while (iVar2 == 1);
  if (iVar2 == -1) {
    return 0;
  }
  p->nMintsCare = p->nMintsCare + p->nCares;
  uVar7 = 1 << ((byte)p->nFanins & 0x1f);
  p->nMintsTotal = p->nMintsTotal + uVar7;
  if (p->pPars->fVeryVerbose != 0) {
    printf("Node %4d : Care = %2d. Total = %2d.  ",(ulong)(uint)pNode->Id,(ulong)(uint)p->nCares,
           (ulong)uVar7);
    Extra_PrintBinary(_stdout,Sign,1 << ((byte)p->nFanins & 0x1f));
    putchar(10);
  }
  if (4 < p->nFanins) {
    return 1;
  }
  switch(p->nFanins) {
  case 1:
    __assert_fail("p->nFanins != 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/mfs/mfsSat.c"
                  ,0x8c,"int Abc_NtkMfsSolveSat(Mfs_Man_t *, Abc_Obj_t *)");
  case 2:
    uVar7 = *Sign;
    uVar3 = uVar7 << 0x1c | uVar7 << 0x18 | uVar7 << 0x14 |
            uVar7 << 0x10 | uVar7 << 0xc | uVar7 << 8 | uVar7 << 4;
    break;
  case 3:
    uVar7 = *Sign;
    uVar3 = uVar7 << 0x18 | uVar7 | uVar7 << 0x10 | uVar7 << 8;
    goto LAB_004662d5;
  case 4:
    uVar7 = *Sign;
    uVar3 = uVar7 << 0x10;
    break;
  default:
    goto switchD_0046627d_default;
  }
  uVar3 = uVar3 | uVar7;
LAB_004662d5:
  *Sign = uVar3;
switchD_0046627d_default:
  return 1;
}

Assistant:

int Abc_NtkMfsSolveSat( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Aig_Obj_t * pObjPo;
    int RetValue, i;
    // collect projection variables
    Vec_IntClear( p->vProjVarsSat );
    Vec_PtrForEachEntryStart( Aig_Obj_t *, p->pAigWin->vCos, pObjPo, i, Aig_ManCoNum(p->pAigWin) - Abc_ObjFaninNum(pNode) )
    {
        assert( p->pCnf->pVarNums[pObjPo->Id] >= 0 );
        Vec_IntPush( p->vProjVarsSat, p->pCnf->pVarNums[pObjPo->Id] );
    }

    // prepare the truth table of care set
    p->nFanins = Vec_IntSize( p->vProjVarsSat );
    p->nWords = Abc_TruthWordNum( p->nFanins );
    memset( p->uCare, 0, sizeof(unsigned) * p->nWords );

    // iterate through the SAT assignments
    p->nCares = 0;
    p->nTotConfLim = p->pPars->nBTLimit;
    while ( (RetValue = Abc_NtkMfsSolveSat_iter(p)) == 1 );
    if ( RetValue == -1 )
        return 0;

    // write statistics
    p->nMintsCare  += p->nCares;
    p->nMintsTotal += (1<<p->nFanins);

    if ( p->pPars->fVeryVerbose )
    {
        printf( "Node %4d : Care = %2d. Total = %2d.  ", pNode->Id, p->nCares, (1<<p->nFanins) );
        Extra_PrintBinary( stdout, p->uCare, (1<<p->nFanins) );
        printf( "\n" );
    }

    // map the care 
    if ( p->nFanins > 4 )
        return 1;
    if ( p->nFanins == 4 )
        p->uCare[0] = p->uCare[0] | (p->uCare[0] << 16);
    if ( p->nFanins == 3 )
        p->uCare[0] = p->uCare[0] | (p->uCare[0] << 8) | (p->uCare[0] << 16) | (p->uCare[0] << 24);
    if ( p->nFanins == 2 )
        p->uCare[0] = p->uCare[0] | (p->uCare[0] <<  4) | (p->uCare[0] <<  8) | (p->uCare[0] << 12) |
              (p->uCare[0] << 16) | (p->uCare[0] << 20) | (p->uCare[0] << 24) | (p->uCare[0] << 28);
    assert( p->nFanins != 1 );
    return 1;
}